

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  istream *piVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  uint16_t data;
  uint16_t start;
  uint16_t pc;
  uint16_t addr;
  CPU cpu;
  SystemMemory m;
  string action;
  stringstream a;
  allocator<char> local_24e [2];
  uint16_t local_24c;
  uint16_t local_24a;
  key_type local_248;
  ulong local_228;
  ulong local_220;
  int local_214;
  CPU local_210;
  SystemMemory local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  long local_1b8 [2];
  ostream local_1a8 [8];
  uint local_1a0 [92];
  
  SystemMemory::SystemMemory(&local_1f8,0x10000);
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  local_210.memory = &local_1f8.super_MemoryBus;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  local_24a = 0;
  local_24c = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,argv[1],local_24e);
  iVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&help_abi_cxx11_._M_h,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    uVar8 = 0;
    uVar7 = 0;
    if (0 < argc) {
      uVar7 = (ulong)(uint)argc;
    }
    local_228 = 0;
    local_220 = 0;
    local_214 = argc;
    for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,argv[uVar8],local_24e)
      ;
      bVar1 = std::operator==(&local_248,"--memory-control");
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,argv[uVar8],local_24e)
      ;
      local_228 = CONCAT71((int7)(local_228 >> 8),(byte)local_228 | bVar1);
      bVar1 = std::operator==(&local_248,"--show-status");
      local_220 = CONCAT71((int7)(local_220 >> 8),(byte)local_220 | bVar1);
      std::__cxx11::string::~string((string *)&local_248);
    }
    lVar10 = (long)local_214;
    poVar5 = std::operator<<(local_1a8,argv[lVar10 + -2]);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,argv[lVar10 + -1]);
    *(uint *)((long)local_1a0 + *(long *)(local_1b8[0] + -0x18)) =
         *(uint *)((long)local_1a0 + *(long *)(local_1b8[0] + -0x18)) & 0xffffffb5 | 8;
    piVar6 = std::istream::_M_extract<unsigned_short>((ushort *)local_1b8);
    std::istream::_M_extract<unsigned_short>((ushort *)piVar6);
    std::__cxx11::stringbuf::str();
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)&local_248);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&local_248);
    CPU::Reset(&local_210,local_24a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,argv[lVar10 + -3],local_24e);
    bVar1 = ReadFile(&local_248,&local_1f8.super_MemoryBus,local_24c);
    std::__cxx11::string::~string((string *)&local_248);
    if (bVar1) {
LAB_00102783:
      do {
        if ((local_220 & 1) != 0) {
          system("clear");
          CPU::GetStatus(&local_210);
        }
        bVar1 = CPU::Execute(&local_210);
        if (bVar1) {
          poVar5 = std::operator<<((ostream *)&std::cout,"BRK Handled");
          std::endl<char,std::char_traits<char>>(poVar5);
          if ((local_228 & 1) == 0) break;
        }
        else if ((local_228 & 1) == 0) goto LAB_00102783;
        std::operator>>((istream *)&std::cin,(string *)&local_1d8);
        std::istream::get();
        bVar1 = std::operator==(&local_1d8,"stack");
        if (bVar1) {
          for (iVar9 = -0x100; iVar9 != 0; iVar9 = iVar9 + 1) {
            *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash +
                     *(long *)(std::cout + -0x18)) =
                 *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash +
                          *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
            bVar2 = SystemMemory::Read(&local_1f8,(short)iVar9 + 0x200);
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uint)bVar2);
            std::operator<<(poVar5," ");
          }
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          std::istream::get();
          goto LAB_00102783;
        }
        bVar1 = std::operator==(&local_1d8,"read");
        if (bVar1) {
          *(uint *)(std::ios_base::Init::~Init + *(long *)(std::cin + -0x18)) =
               *(uint *)(std::ios_base::Init::~Init + *(long *)(std::cin + -0x18)) & 0xffffffb5 | 8;
          std::istream::_M_extract<unsigned_short>((ushort *)&std::cin);
          std::istream::get();
          poVar5 = std::operator<<((ostream *)&std::cout,"Memory content at 0x");
          *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
               *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,(uint)(ushort)local_248._M_dataplus._M_p);
          poVar5 = std::operator<<(poVar5," = ");
          bVar2 = SystemMemory::Read(&local_1f8,(ushort)local_248._M_dataplus._M_p);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)bVar2);
          std::endl<char,std::char_traits<char>>(poVar5);
          std::istream::get();
          goto LAB_00102783;
        }
        bVar1 = std::operator==(&local_1d8,"write");
        if (bVar1) {
          *(uint *)(std::ios_base::Init::~Init + *(long *)(std::cin + -0x18)) =
               *(uint *)(std::ios_base::Init::~Init + *(long *)(std::cin + -0x18)) & 0xffffffb5 | 8;
          piVar6 = std::istream::_M_extract<unsigned_short>((ushort *)&std::cin);
          std::istream::_M_extract<unsigned_short>((ushort *)piVar6);
          std::istream::get();
          SystemMemory::Write(&local_1f8,(ushort)local_248._M_dataplus._M_p,(uint8_t)local_24e[0]);
          goto LAB_00102783;
        }
        bVar1 = std::operator==(&local_1d8,"stop");
      } while (!bVar1);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,"Error: can\'t read file");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,argv[1],local_24e);
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)&help_abi_cxx11_,&local_248);
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)pmVar4);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&local_248);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  SystemMemory::~SystemMemory(&local_1f8);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    SystemMemory m(1024 * 64);
    CPU cpu(m);
    
    std::string action;
    std::stringstream a;

    uint16_t pc{}, start{};
    bool memoryControl{}, status{};
    
    if(help.find(argv[1]) != help.end())
    {
        std::cout << help.at(argv[1]) << std::endl;
        
        return 0;
    }

    for(int i = 0; i < argc; i++)
    {
        memoryControl = (std::string(argv[i]) == "--memory-control" ? true : memoryControl);
        status = (std::string(argv[i]) == "--show-status" ? true : status);
    }

    a << argv[argc - 2] << " " << argv[argc - 1];
    a >> std::hex >> start >> pc;

    std::cout << a.str() << std::endl;

    cpu.Reset(pc);
    
    if(!ReadFile(argv[argc - 3], m, start))
    {
        std::cout << "Error: can't read file" << std::endl;
        
        return 0;
    }

    while(true)
    {
        if(status)
        {
            system("clear");
            cpu.GetStatus();
        }
        
        if(cpu.Execute())
        {
            std::cout << "BRK Handled" << std::endl;
            
            if(!memoryControl)
                break;
        }

        if(memoryControl)
        {
            (std::cin >> action).get();

            if(action == "stack")
            {
                for(int i = 0; i < 256; i++)
                    std::cout << std::hex << (int)m.Read(0x0100 + i) << " ";
                
                std::cout << std::endl;

                std::cin.get();
            }
            else if(action == "read")
            {
                uint16_t addr;
                
                (std::cin >> std::hex >> addr).get();
                std::cout << "Memory content at 0x" << std::hex << (int)addr << " = " << (int)m.Read(addr) << std::endl;
                
                std::cin.get();
            }
            else if(action == "write")
            {
                uint16_t addr, data;

                (std::cin >> std::hex >> addr >> data).get();
                
                m.Write(addr, static_cast<uint8_t>(data));
            }
            else if(action == "stop")
                return 0;
        }
    } 
}